

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O1

void __thiscall
TPZNonLinMultGridAnalysis::CoutTime(TPZNonLinMultGridAnalysis *this,clock_t *start,char *title)

{
  long lVar1;
  clock_t cVar2;
  size_t sVar3;
  ostream *poVar4;
  long *plVar5;
  
  cVar2 = clock();
  if (title == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a5d2a8);
  }
  else {
    sVar3 = strlen(title);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,title,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  lVar1 = *start;
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," segundos",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<double>((double)((cVar2 - lVar1) / 1000000) / 60.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," minutos",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::CoutTime(clock_t &start,const char *title){
    clock_t end = clock();
    cout << title <<  endl;
    clock_t segundos = ((end - start)/CLOCKS_PER_SEC);
    cout << segundos << " segundos" << endl;
    cout << segundos/60.0 << " minutos" << endl << endl;
}